

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseHTML(TidyDocImpl *doc,Node *html,GetTokenMode mode)

{
  Node **ppNVar1;
  TidyTagId TVar2;
  Dict *pDVar3;
  Bool BVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node **ppNVar7;
  Node *pNVar8;
  Node *pNVar9;
  
  prvTidySetOptionBool(doc,TidyXmlTags,no);
  do {
    while( true ) {
      pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
      if (pNVar5 == (Node *)0x0) goto LAB_00142d5a;
      pDVar3 = pNVar5->tag;
      if ((pDVar3 != (Dict *)0x0) && (pDVar3->id == TidyTag_HEAD)) goto LAB_00142d68;
      if ((pDVar3 != html->tag) || (1 < pNVar5->type - StartTag)) break;
      prvTidyReport(doc,html,pNVar5,0x235);
      prvTidyFreeNode(doc,pNVar5);
    }
    BVar4 = InsertMisc(html,pNVar5);
  } while (BVar4 != no);
  prvTidyUngetToken(doc);
LAB_00142d5a:
  pNVar5 = prvTidyInferredTag(doc,TidyTag_HEAD);
LAB_00142d68:
  pNVar5->parent = html;
  pNVar8 = html->last;
  pNVar5->prev = pNVar8;
  ppNVar1 = &html->content;
  ppNVar7 = &pNVar8->next;
  if (pNVar8 == (Node *)0x0) {
    ppNVar7 = ppNVar1;
  }
  *ppNVar7 = pNVar5;
  html->last = pNVar5;
  prvTidyParseHead(doc,pNVar5,(GetTokenMode)ppNVar1);
  pNVar5 = (Node *)0x0;
  pNVar8 = (Node *)0x0;
LAB_00142d9f:
  pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar6 == (Node *)0x0) {
    if (pNVar8 == (Node *)0x0) {
      pNVar8 = prvTidyInferredTag(doc,TidyTag_BODY);
      pNVar8->parent = html;
      pNVar5 = html->last;
      pNVar8->prev = pNVar5;
      ppNVar7 = &pNVar5->next;
      if (pNVar5 == (Node *)0x0) {
        ppNVar7 = ppNVar1;
      }
      *ppNVar7 = pNVar8;
      html->last = pNVar8;
      prvTidyParseBody(doc,pNVar8,(GetTokenMode)ppNVar7);
      return;
    }
    return;
  }
  if (pNVar6->tag != html->tag) goto code_r0x00142dbf;
  if (pNVar8 == (Node *)0x0 && pNVar6->type != StartTag) goto LAB_00142e53;
  goto LAB_00142e68;
code_r0x00142dbf:
  BVar4 = InsertMisc(html,pNVar6);
  if (BVar4 != no) goto LAB_00142d9f;
  if (pNVar6->tag == (Dict *)0x0) {
LAB_00142e78:
    BVar4 = prvTidynodeIsElement(pNVar6);
    if ((BVar4 != no) && (pDVar3 = pNVar6->tag, pDVar3 != (Dict *)0x0)) {
      if ((pDVar3->model & 4) != 0) {
        MoveToHead(doc,html,pNVar6);
        goto LAB_00142d9f;
      }
      if ((pNVar8 != (Node *)0x0) && (pDVar3->id == TidyTag_FRAME)) {
LAB_00142e53:
        prvTidyReport(doc,html,pNVar6,0x235);
LAB_00142e68:
        prvTidyFreeNode(doc,pNVar6);
        goto LAB_00142d9f;
      }
    }
    prvTidyUngetToken(doc);
    if (pNVar8 != (Node *)0x0) {
      if (pNVar5 == (Node *)0x0) {
        pNVar5 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
        pNVar5->parent = pNVar8;
        pNVar6 = pNVar8->last;
        pNVar5->prev = pNVar6;
        ppNVar7 = &pNVar6->next;
        if (pNVar6 == (Node *)0x0) {
          ppNVar7 = &pNVar8->content;
        }
        *ppNVar7 = pNVar5;
        pNVar8->last = pNVar5;
      }
      else {
        prvTidyReport(doc,html,pNVar6,0x267);
        if (pNVar5->type == StartEndTag) {
          pNVar5->type = StartTag;
        }
      }
      prvTidyConstrainVersion(doc,0x490);
LAB_00142fda:
      ParseTag(doc,pNVar5,mode);
      goto LAB_00142d9f;
    }
    pNVar6 = prvTidyInferredTag(doc,TidyTag_BODY);
    if (*(int *)((doc->config).value + 6) != 1) {
      prvTidyReport(doc,html,pNVar6,0x247);
    }
  }
  else {
    TVar2 = pNVar6->tag->id;
    if (TVar2 == TidyTag_NOFRAMES) {
      if (pNVar6->type != StartTag) goto LAB_00142e53;
      if (pNVar8 == (Node *)0x0) {
        prvTidyReport(doc,html,pNVar6,0x235);
        prvTidyFreeNode(doc,pNVar6);
        pNVar6 = prvTidyInferredTag(doc,TidyTag_BODY);
        goto LAB_0014310c;
      }
      if (pNVar5 == (Node *)0x0) {
        pNVar6->parent = pNVar8;
        pNVar5 = pNVar8->last;
        ppNVar7 = &pNVar5->next;
        if (pNVar5 == (Node *)0x0) {
          ppNVar7 = &pNVar8->content;
        }
        pNVar6->prev = pNVar5;
        *ppNVar7 = pNVar6;
        pNVar8->last = pNVar6;
        pNVar5 = pNVar6;
      }
      else {
        prvTidyFreeNode(doc,pNVar6);
      }
      goto LAB_00142fda;
    }
    if (TVar2 == TidyTag_FRAMESET) {
      if (pNVar6->type == StartTag) {
        pNVar9 = pNVar6;
        if (pNVar8 != (Node *)0x0) {
          prvTidyReport(doc,html,pNVar6,0x237);
          pNVar9 = pNVar8;
        }
        pNVar6->parent = html;
        pNVar8 = html->last;
        pNVar6->prev = pNVar8;
        ppNVar7 = &pNVar8->next;
        if (pNVar8 == (Node *)0x0) {
          ppNVar7 = ppNVar1;
        }
        *ppNVar7 = pNVar6;
        html->last = pNVar6;
        ParseTag(doc,pNVar6,mode);
        ppNVar7 = &pNVar9->content;
        while (pNVar6 = *ppNVar7, pNVar8 = pNVar9, pNVar6 != (Node *)0x0) {
          if ((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TidyTag_NOFRAMES)) {
            pNVar5 = pNVar6;
          }
          ppNVar7 = &pNVar6->next;
        }
        goto LAB_00142d9f;
      }
      goto LAB_00142e53;
    }
    if (TVar2 != TidyTag_BODY) goto LAB_00142e78;
    if (pNVar6->type != StartTag) goto LAB_00142e53;
    if (((doc->config).value[1].v == 0) && (pNVar8 != (Node *)0x0)) {
      prvTidyUngetToken(doc);
      if (pNVar5 == (Node *)0x0) {
        pNVar5 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
        pNVar5->parent = pNVar8;
        pNVar6 = pNVar8->last;
        pNVar5->prev = pNVar6;
        ppNVar7 = &pNVar6->next;
        if (pNVar6 == (Node *)0x0) {
          ppNVar7 = &pNVar8->content;
        }
        *ppNVar7 = pNVar5;
        pNVar8->last = pNVar5;
        prvTidyReport(doc,html,pNVar5,0x247);
      }
      else if (pNVar5->type == StartEndTag) {
        pNVar5->type = StartTag;
      }
      goto LAB_00142fda;
    }
  }
  prvTidyConstrainVersion(doc,0xfffffb6f);
LAB_0014310c:
  pNVar6->parent = html;
  pNVar5 = html->last;
  pNVar6->prev = pNVar5;
  ppNVar7 = &pNVar5->next;
  if (pNVar5 == (Node *)0x0) {
    ppNVar7 = ppNVar1;
  }
  *ppNVar7 = pNVar6;
  html->last = pNVar6;
  ParseTag(doc,pNVar6,mode);
  return;
}

Assistant:

void TY_(ParseHTML)(TidyDocImpl* doc, Node *html, GetTokenMode mode)
{
    Node *node, *head;
    Node *frameset = NULL;
    Node *noframes = NULL;

    DEBUG_LOG(SPRTF("Entering ParseHTML...\n"));
    TY_(SetOptionBool)( doc, TidyXmlTags, no );

    for (;;)
    {
        node = TY_(GetToken)(doc, IgnoreWhitespace);

        if (node == NULL)
        {
            node = TY_(InferredTag)(doc, TidyTag_HEAD);
            break;
        }

        if ( nodeIsHEAD(node) )
            break;

        if (node->tag == html->tag && node->type == EndTag)
        {
            TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* find and discard multiple <html> elements */
        if (node->tag == html->tag && node->type == StartTag)
        {
            TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(html, node))
            continue;

        TY_(UngetToken)( doc );
        node = TY_(InferredTag)(doc, TidyTag_HEAD);
        break;
    }

    head = node;
    TY_(InsertNodeAtEnd)(html, head);
    TY_(ParseHead)(doc, head, mode);

    for (;;)
    {
        node = TY_(GetToken)(doc, IgnoreWhitespace);

        if (node == NULL)
        {
            if (frameset == NULL) /* implied body */
            {
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                TY_(InsertNodeAtEnd)(html, node);
                TY_(ParseBody)(doc, node, mode);
            }

            DEBUG_LOG(SPRTF("Exit ParseHTML 1...\n"));
            return;
        }

        /* robustly handle html tags */
        if (node->tag == html->tag)
        {
            if (node->type != StartTag && frameset == NULL)
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(html, node))
            continue;

        /* if frameset document coerce <body> to <noframes> */
        if ( nodeIsBODY(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
            {
                if (frameset != NULL)
                {
                    TY_(UngetToken)( doc );

                    if (noframes == NULL)
                    {
                        noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                        TY_(Report)(doc, html, noframes, INSERTING_TAG);
                    }
                    else
                    {
                        if (noframes->type == StartEndTag)
                            noframes->type = StartTag;
                    }

                    ParseTag(doc, noframes, mode);
                    continue;
                }
            }

            TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
            break;  /* to parse body */
        }

        /* flag an error if we see more than one frameset */
        if ( nodeIsFRAMESET(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if (frameset != NULL)
                TY_(Report)(doc, html, node, DUPLICATE_FRAMESET);
            else
                frameset = node;

            TY_(InsertNodeAtEnd)(html, node);
            ParseTag(doc, node, mode);

            /*
              see if it includes a noframes element so
              that we can merge subsequent noframes elements
            */

            for (node = frameset->content; node; node = node->next)
            {
                if ( nodeIsNOFRAMES(node) )
                    noframes = node;
            }
            continue;
        }

        /* if not a frameset document coerce <noframes> to <body> */
        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if (frameset == NULL)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                break;
            }

            if (noframes == NULL)
            {
                noframes = node;
                TY_(InsertNodeAtEnd)(frameset, noframes);
            }
            else
                TY_(FreeNode)( doc, node);

            ParseTag(doc, noframes, mode);
            continue;
        }

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, html, node);
                continue;
            }

            /* discard illegal frame element following a frameset */
            if ( frameset != NULL && nodeIsFRAME(node) )
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
        }

        TY_(UngetToken)( doc );

        /* insert other content into noframes element */

        if (frameset)
        {
            if (noframes == NULL)
            {
                noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                TY_(InsertNodeAtEnd)(frameset, noframes);
            }
            else
            {
                TY_(Report)(doc, html, node, NOFRAMES_CONTENT);
                if (noframes->type == StartEndTag)
                    noframes->type = StartTag;
            }

            TY_(ConstrainVersion)(doc, VERS_FRAMESET);
            ParseTag(doc, noframes, mode);
            continue;
        }

        node = TY_(InferredTag)(doc, TidyTag_BODY);
        /* Issue #132 - disable inserting BODY tag warning
           BUT only if NOT --show-body-only yes */
        if (!showingBodyOnly(doc))
            TY_(Report)(doc, html, node, INSERTING_TAG );
        TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
        break;
    }

    /* node must be body */

    TY_(InsertNodeAtEnd)(html, node);
    ParseTag(doc, node, mode);
    DEBUG_LOG(SPRTF("Exit ParseHTML 2...\n"));
}